

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

BBox * __thiscall CMU462::DynamicScene::Mesh::get_bbox(BBox *__return_storage_ptr__,Mesh *this)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar1;
  _List_node_base *p_Var2;
  
  BBox::BBox(__return_storage_ptr__);
  plVar1 = &(this->mesh).vertices;
  p_Var2 = (_List_node_base *)plVar1;
  while (p_Var2 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var2->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)plVar1) {
    BBox::expand(__return_storage_ptr__,(Vector3D *)&p_Var2[1]._M_prev);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox Mesh::get_bbox() {
  BBox bbox;
  for (VertexIter it = mesh.verticesBegin(); it != mesh.verticesEnd(); it++) {
    bbox.expand(it->position);
  }
  return bbox;
}